

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cpp
# Opt level: O1

void __thiscall
libcellml::Validator::ValidatorImpl::validateVariable
          (ValidatorImpl *this,VariablePtr *variable,NameList *variableNames)

{
  ulong uVar1;
  pointer puVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  IssueImpl *pIVar4;
  _Alloc_hider _Var5;
  size_type sVar6;
  ValidatorImpl *pVVar7;
  bool bVar8;
  ReferenceRule RVar9;
  int iVar10;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var11;
  long *plVar12;
  undefined8 *puVar13;
  ulong *puVar14;
  element_type **ppeVar15;
  size_type *psVar16;
  Component *pCVar17;
  undefined8 *puVar18;
  pointer name;
  pointer psVar19;
  Component *pCVar20;
  pointer psVar21;
  element_type *peVar22;
  element_type *peVar23;
  undefined8 uVar24;
  pointer puVar25;
  string unitsName;
  IssuePtr issue;
  IssuePtr issue_1;
  ModelPtr model;
  ComponentPtr component;
  string variableName;
  IssuePtr issue_4;
  IssuePtr issue_3;
  string local_1b8;
  undefined1 local_198 [32];
  element_type **local_178;
  long local_170;
  element_type *local_168;
  undefined8 uStack_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  string local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  undefined1 local_f8 [32];
  string local_d8;
  undefined1 local_b8 [32];
  ParentedEntityConstPtr local_98;
  ValidatorImpl *local_88;
  string local_80;
  string local_60;
  Issue *local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  local_80._M_dataplus._M_p =
       (pointer)(variable->super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr;
  local_80._M_string_length =
       (size_type)
       (variable->super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
       _M_pi;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._M_string_length)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._M_string_length)->_M_use_count
           + 1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._M_string_length)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._M_string_length)->_M_use_count
           + 1;
    }
  }
  owningComponent(&local_98);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._M_string_length);
  }
  name = (pointer)(variable->super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr;
  NamedEntity::name_abi_cxx11_(&local_80,(NamedEntity *)name);
  local_88 = this;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    name = (variableNames->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
    _Var11 = std::
             __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                       ((variableNames->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start,name,&local_80);
    if (_Var11._M_current !=
        (variableNames->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      Issue::IssueImpl::create();
      pIVar4 = *(IssueImpl **)(local_158._M_dataplus._M_p + 8);
      NamedEntity::name_abi_cxx11_
                (&local_138,
                 (NamedEntity *)
                 local_98.
                 super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr);
      plVar12 = (long *)std::__cxx11::string::replace((ulong)&local_138,0,(char *)0x0,0x2b6f4a);
      puVar14 = (ulong *)(plVar12 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar14) {
        local_118.field_2._M_allocated_capacity = *puVar14;
        local_118.field_2._8_8_ = plVar12[3];
        local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      }
      else {
        local_118.field_2._M_allocated_capacity = *puVar14;
        local_118._M_dataplus._M_p = (pointer)*plVar12;
      }
      local_118._M_string_length = plVar12[1];
      *plVar12 = (long)puVar14;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      puVar13 = (undefined8 *)std::__cxx11::string::append((char *)&local_118);
      ppeVar15 = (element_type **)(puVar13 + 2);
      if ((element_type **)*puVar13 == ppeVar15) {
        local_168 = *ppeVar15;
        uStack_160 = puVar13[3];
        local_178 = &local_168;
      }
      else {
        local_168 = *ppeVar15;
        local_178 = (element_type **)*puVar13;
      }
      local_170 = puVar13[1];
      *puVar13 = ppeVar15;
      puVar13[1] = 0;
      *(undefined1 *)(puVar13 + 2) = 0;
      plVar12 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&local_178,(ulong)local_80._M_dataplus._M_p);
      pCVar20 = (Component *)(plVar12 + 2);
      if ((Component *)*plVar12 == pCVar20) {
        local_198._16_8_ =
             (pCVar20->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity.
             _vptr_Entity;
        local_198._24_8_ = plVar12[3];
        local_198._0_8_ = (Component *)(local_198 + 0x10);
      }
      else {
        local_198._16_8_ =
             (pCVar20->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity.
             _vptr_Entity;
        local_198._0_8_ = (Component *)*plVar12;
      }
      local_198._8_8_ = plVar12[1];
      *plVar12 = (long)pCVar20;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      puVar13 = (undefined8 *)std::__cxx11::string::append(local_198);
      psVar16 = puVar13 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar13 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar16) {
        local_1b8.field_2._M_allocated_capacity = *psVar16;
        local_1b8.field_2._8_8_ = puVar13[3];
        local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
      }
      else {
        local_1b8.field_2._M_allocated_capacity = *psVar16;
        local_1b8._M_dataplus._M_p = (pointer)*puVar13;
      }
      local_1b8._M_string_length = puVar13[1];
      *puVar13 = psVar16;
      puVar13[1] = 0;
      *(undefined1 *)(puVar13 + 2) = 0;
      Issue::IssueImpl::setDescription(pIVar4,&local_1b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
        operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
      }
      if ((Component *)local_198._0_8_ != (Component *)(local_198 + 0x10)) {
        operator_delete((void *)local_198._0_8_,(ulong)(local_198._16_8_ + 1));
      }
      this = local_88;
      if (local_178 != &local_168) {
        operator_delete(local_178,
                        (ulong)((long)&(local_168->super_ComponentEntity).super_NamedEntity.
                                       super_ParentedEntity.super_Entity._vptr_Entity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p,
                        (ulong)(local_138.field_2._M_allocated_capacity + 1));
      }
      AnyCellmlElement::AnyCellmlElementImpl::setComponent
                ((AnyCellmlElementImpl *)
                 **(undefined8 **)(*(long *)(local_158._M_dataplus._M_p + 8) + 0x28),
                 (ComponentPtr *)&local_98,COMPONENT);
      Issue::IssueImpl::setReferenceRule
                (*(IssueImpl **)(local_158._M_dataplus._M_p + 8),VARIABLE_NAME_UNIQUE);
      name = &local_158;
      Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)name);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._M_string_length);
      }
    }
  }
  RVar9 = validateCellmlIdentifier(&local_80);
  if (RVar9 != UNDEFINED) {
    makeIssueIllegalIdentifier((ValidatorImpl *)local_f8,name);
    pIVar4 = *(IssueImpl **)(local_f8._0_8_ + 8);
    std::operator+(&local_138,"Variable \'",&local_80);
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_138);
    paVar3 = &local_118.field_2;
    puVar14 = (ulong *)(plVar12 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar12 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar14) {
      local_118.field_2._M_allocated_capacity = *puVar14;
      local_118.field_2._8_8_ = plVar12[3];
      local_118._M_dataplus._M_p = (pointer)paVar3;
    }
    else {
      local_118.field_2._M_allocated_capacity = *puVar14;
      local_118._M_dataplus._M_p = (pointer)*plVar12;
    }
    local_118._M_string_length = plVar12[1];
    *plVar12 = (long)puVar14;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    NamedEntity::name_abi_cxx11_
              (&local_158,
               (NamedEntity *)
               local_98.
               super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr);
    uVar1 = (long)(_func_int ***)local_158._M_string_length + local_118._M_string_length;
    uVar24 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != paVar3) {
      uVar24 = local_118.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar24 < uVar1) {
      uVar24 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != &local_158.field_2) {
        uVar24 = local_158.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar24 < uVar1) goto LAB_0027872f;
      puVar13 = (undefined8 *)
                std::__cxx11::string::replace
                          ((ulong)&local_158,0,(char *)0x0,(ulong)local_118._M_dataplus._M_p);
    }
    else {
LAB_0027872f:
      puVar13 = (undefined8 *)
                std::__cxx11::string::_M_append
                          ((char *)&local_118,(ulong)local_158._M_dataplus._M_p);
    }
    local_178 = &local_168;
    ppeVar15 = (element_type **)(puVar13 + 2);
    if ((element_type **)*puVar13 == ppeVar15) {
      local_168 = *ppeVar15;
      uStack_160 = puVar13[3];
    }
    else {
      local_168 = *ppeVar15;
      local_178 = (element_type **)*puVar13;
    }
    local_170 = puVar13[1];
    *puVar13 = ppeVar15;
    puVar13[1] = 0;
    *(undefined1 *)ppeVar15 = 0;
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_178);
    pCVar20 = (Component *)(local_198 + 0x10);
    pCVar17 = (Component *)(plVar12 + 2);
    if ((Component *)*plVar12 == pCVar17) {
      local_198._16_8_ =
           (pCVar17->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity.
           _vptr_Entity;
      local_198._24_8_ = plVar12[3];
      local_198._0_8_ = pCVar20;
    }
    else {
      local_198._16_8_ =
           (pCVar17->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity.
           _vptr_Entity;
      local_198._0_8_ = (Component *)*plVar12;
    }
    local_198._8_8_ = plVar12[1];
    *plVar12 = (long)pCVar17;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    Issue::description_abi_cxx11_(&local_d8,(Issue *)local_f8._0_8_);
    psVar19 = (pointer)0xf;
    if ((Component *)local_198._0_8_ != pCVar20) {
      psVar19 = (pointer)local_198._16_8_;
    }
    if (psVar19 < (pointer)(local_d8._M_string_length + local_198._8_8_)) {
      uVar24 = (pointer)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        uVar24 = local_d8.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar24 < (pointer)(local_d8._M_string_length + local_198._8_8_)) goto LAB_0027884d;
      puVar13 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_d8,0,(char *)0x0,local_198._0_8_);
    }
    else {
LAB_0027884d:
      puVar13 = (undefined8 *)
                std::__cxx11::string::_M_append(local_198,(ulong)local_d8._M_dataplus._M_p);
    }
    local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
    psVar16 = puVar13 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar13 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar16) {
      local_1b8.field_2._M_allocated_capacity = *psVar16;
      local_1b8.field_2._8_8_ = puVar13[3];
    }
    else {
      local_1b8.field_2._M_allocated_capacity = *psVar16;
      local_1b8._M_dataplus._M_p = (pointer)*puVar13;
    }
    local_1b8._M_string_length = puVar13[1];
    *puVar13 = psVar16;
    puVar13[1] = 0;
    *(undefined1 *)psVar16 = 0;
    Issue::IssueImpl::setDescription(pIVar4,&local_1b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,(ulong)(local_d8.field_2._M_allocated_capacity + 1))
      ;
    }
    if ((Component *)local_198._0_8_ != pCVar20) {
      operator_delete((void *)local_198._0_8_,(ulong)(local_198._16_8_ + 1));
    }
    if (local_178 != &local_168) {
      operator_delete(local_178,
                      (ulong)((long)&(local_168->super_ComponentEntity).super_NamedEntity.
                                     super_ParentedEntity.super_Entity._vptr_Entity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != paVar3) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p,
                      (ulong)(local_138.field_2._M_allocated_capacity + 1));
    }
    AnyCellmlElement::AnyCellmlElementImpl::setVariable
              ((((*(IssueImpl **)(local_f8._0_8_ + 8))->mItem).
                super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
               ->mPimpl,variable);
    Issue::IssueImpl::setReferenceRule(*(IssueImpl **)(local_f8._0_8_ + 8),VARIABLE_NAME_VALUE);
    Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)local_f8);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_);
    }
  }
  Entity::id_abi_cxx11_
            (&local_1b8,
             (Entity *)
             (variable->super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
  ;
  bVar8 = isValidXmlName(&local_1b8);
  paVar3 = &local_1b8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != paVar3) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  if (!bVar8) {
    Issue::IssueImpl::create();
    Issue::IssueImpl::setReferenceRule
              (*(IssueImpl **)(local_158._M_dataplus._M_p + 8),XML_ID_ATTRIBUTE);
    AnyCellmlElement::AnyCellmlElementImpl::setVariable
              ((AnyCellmlElementImpl *)
               **(undefined8 **)(*(long *)(local_158._M_dataplus._M_p + 8) + 0x28),variable);
    pIVar4 = *(IssueImpl **)(local_158._M_dataplus._M_p + 8);
    std::operator+(&local_118,"Variable \'",&local_80);
    puVar13 = (undefined8 *)std::__cxx11::string::append((char *)&local_118);
    ppeVar15 = (element_type **)(puVar13 + 2);
    if ((element_type **)*puVar13 == ppeVar15) {
      local_168 = *ppeVar15;
      uStack_160 = puVar13[3];
      local_178 = &local_168;
    }
    else {
      local_168 = *ppeVar15;
      local_178 = (element_type **)*puVar13;
    }
    local_170 = puVar13[1];
    *puVar13 = ppeVar15;
    puVar13[1] = 0;
    *(undefined1 *)(puVar13 + 2) = 0;
    Entity::id_abi_cxx11_
              (&local_138,
               (Entity *)
               (variable->super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr);
    peVar22 = (element_type *)0xf;
    if (local_178 != &local_168) {
      peVar22 = local_168;
    }
    if (peVar22 < (element_type *)(local_170 + local_138._M_string_length)) {
      uVar24 = (element_type *)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        uVar24 = local_138.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar24 < (element_type *)(local_170 + local_138._M_string_length))
      goto LAB_00278b24;
      plVar12 = (long *)std::__cxx11::string::replace
                                  ((ulong)&local_138,0,(char *)0x0,(ulong)local_178);
    }
    else {
LAB_00278b24:
      plVar12 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&local_178,(ulong)local_138._M_dataplus._M_p);
    }
    local_198._0_8_ = local_198 + 0x10;
    pCVar20 = (Component *)(plVar12 + 2);
    if ((Component *)*plVar12 == pCVar20) {
      local_198._16_8_ =
           (pCVar20->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity.
           _vptr_Entity;
      local_198._24_8_ = plVar12[3];
    }
    else {
      local_198._16_8_ =
           (pCVar20->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity.
           _vptr_Entity;
      local_198._0_8_ = (Component *)*plVar12;
    }
    local_198._8_8_ = plVar12[1];
    *plVar12 = (long)pCVar20;
    plVar12[1] = 0;
    *(undefined1 *)
     &(pCVar20->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity.
      _vptr_Entity = 0;
    puVar13 = (undefined8 *)std::__cxx11::string::append(local_198);
    psVar16 = puVar13 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar13 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar16) {
      local_1b8.field_2._M_allocated_capacity = *psVar16;
      local_1b8.field_2._8_8_ = puVar13[3];
      local_1b8._M_dataplus._M_p = (pointer)paVar3;
    }
    else {
      local_1b8.field_2._M_allocated_capacity = *psVar16;
      local_1b8._M_dataplus._M_p = (pointer)*puVar13;
    }
    local_1b8._M_string_length = puVar13[1];
    *puVar13 = psVar16;
    puVar13[1] = 0;
    *(undefined1 *)(puVar13 + 2) = 0;
    Issue::IssueImpl::setDescription(pIVar4,&local_1b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != paVar3) {
      operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
    }
    if ((Component *)local_198._0_8_ != (Component *)(local_198 + 0x10)) {
      operator_delete((void *)local_198._0_8_,(ulong)(local_198._16_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p,
                      (ulong)(local_138.field_2._M_allocated_capacity + 1));
    }
    if (local_178 != &local_168) {
      operator_delete(local_178,
                      (ulong)((long)&(local_168->super_ComponentEntity).super_NamedEntity.
                                     super_ParentedEntity.super_Entity._vptr_Entity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)&local_158);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._M_string_length);
    }
  }
  Variable::units((variable->super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr);
  _Var5._M_p = local_1b8._M_dataplus._M_p;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._M_string_length);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var5._M_p ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    Issue::IssueImpl::create();
    pIVar4 = *(IssueImpl **)(local_158._M_dataplus._M_p + 8);
    std::operator+(&local_118,"Variable \'",&local_80);
    puVar13 = (undefined8 *)std::__cxx11::string::append((char *)&local_118);
    ppeVar15 = (element_type **)(puVar13 + 2);
    if ((element_type **)*puVar13 == ppeVar15) {
      local_168 = *ppeVar15;
      uStack_160 = puVar13[3];
      local_178 = &local_168;
    }
    else {
      local_168 = *ppeVar15;
      local_178 = (element_type **)*puVar13;
    }
    local_170 = puVar13[1];
    *puVar13 = ppeVar15;
    puVar13[1] = 0;
    *(undefined1 *)(puVar13 + 2) = 0;
    NamedEntity::name_abi_cxx11_
              (&local_138,
               (NamedEntity *)
               local_98.
               super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr);
    peVar22 = (element_type *)0xf;
    if (local_178 != &local_168) {
      peVar22 = local_168;
    }
    if (peVar22 < (element_type *)(local_170 + local_138._M_string_length)) {
      uVar24 = (element_type *)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        uVar24 = local_138.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar24 < (element_type *)(local_170 + local_138._M_string_length))
      goto LAB_00278f5b;
      plVar12 = (long *)std::__cxx11::string::replace
                                  ((ulong)&local_138,0,(char *)0x0,(ulong)local_178);
    }
    else {
LAB_00278f5b:
      plVar12 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&local_178,(ulong)local_138._M_dataplus._M_p);
    }
    local_198._0_8_ = local_198 + 0x10;
    pCVar20 = (Component *)(plVar12 + 2);
    if ((Component *)*plVar12 == pCVar20) {
      local_198._16_8_ =
           (pCVar20->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity.
           _vptr_Entity;
      local_198._24_8_ = plVar12[3];
    }
    else {
      local_198._16_8_ =
           (pCVar20->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity.
           _vptr_Entity;
      local_198._0_8_ = (Component *)*plVar12;
    }
    local_198._8_8_ = plVar12[1];
    *plVar12 = (long)pCVar20;
    plVar12[1] = 0;
    *(undefined1 *)
     &(pCVar20->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity.
      _vptr_Entity = 0;
    puVar13 = (undefined8 *)std::__cxx11::string::append(local_198);
    psVar16 = puVar13 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar13 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar16) {
      local_1b8.field_2._M_allocated_capacity = *psVar16;
      local_1b8.field_2._8_8_ = puVar13[3];
      local_1b8._M_dataplus._M_p = (pointer)paVar3;
    }
    else {
      local_1b8.field_2._M_allocated_capacity = *psVar16;
      local_1b8._M_dataplus._M_p = (pointer)*puVar13;
    }
    local_1b8._M_string_length = puVar13[1];
    *puVar13 = psVar16;
    puVar13[1] = 0;
    *(undefined1 *)(puVar13 + 2) = 0;
    Issue::IssueImpl::setDescription(pIVar4,&local_1b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != paVar3) {
      operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
    }
    if ((Component *)local_198._0_8_ != (Component *)(local_198 + 0x10)) {
      operator_delete((void *)local_198._0_8_,(ulong)(local_198._16_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p,
                      (ulong)(local_138.field_2._M_allocated_capacity + 1));
    }
    if (local_178 != &local_168) {
      operator_delete(local_178,
                      (ulong)((long)&(local_168->super_ComponentEntity).super_NamedEntity.
                                     super_ParentedEntity.super_Entity._vptr_Entity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    AnyCellmlElement::AnyCellmlElementImpl::setVariable
              ((AnyCellmlElementImpl *)
               **(undefined8 **)(*(long *)(local_158._M_dataplus._M_p + 8) + 0x28),variable);
    Issue::IssueImpl::setReferenceRule
              (*(IssueImpl **)(local_158._M_dataplus._M_p + 8),VARIABLE_UNITS_VALUE);
    Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)&local_158);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._M_string_length);
    }
  }
  else {
    Variable::units((variable->super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr);
    pCVar20 = (Component *)local_198._0_8_;
    NamedEntity::name_abi_cxx11_(&local_1b8,(NamedEntity *)local_198._0_8_);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_);
    }
    RVar9 = validateCellmlIdentifier(&local_1b8);
    if (RVar9 == UNDEFINED) {
      bVar8 = isStandardUnitName(&local_1b8);
      if (!bVar8) {
        local_198._0_8_ =
             local_98.
             super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_198._8_8_ =
             local_98.
             super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
        if (local_98.super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_98.
             super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_98.
                  super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_98.
             super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_98.
                  super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        owningModel((ParentedEntityConstPtr *)local_b8);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_);
        }
        bVar8 = Model::hasUnits((Model *)local_b8._0_8_,&local_1b8);
        local_38._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_;
        if (!bVar8) {
          Issue::IssueImpl::create();
          pIVar4 = *(IssueImpl **)(local_60._M_dataplus._M_p + 8);
          std::operator+(&local_d8,"Variable \'",&local_80);
          puVar13 = (undefined8 *)std::__cxx11::string::append((char *)&local_d8);
          paVar3 = &local_158.field_2;
          puVar14 = puVar13 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar13 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar14) {
            local_158.field_2._M_allocated_capacity = *puVar14;
            local_158.field_2._8_8_ = puVar13[3];
            local_158._M_dataplus._M_p = (pointer)paVar3;
          }
          else {
            local_158.field_2._M_allocated_capacity = *puVar14;
            local_158._M_dataplus._M_p = (pointer)*puVar13;
          }
          local_158._M_string_length = puVar13[1];
          *puVar13 = puVar14;
          puVar13[1] = 0;
          *(undefined1 *)(puVar13 + 2) = 0;
          NamedEntity::name_abi_cxx11_
                    ((string *)local_f8,
                     (NamedEntity *)
                     local_98.
                     super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr);
          puVar2 = (pointer)((long)(_func_int ***)local_158._M_string_length +
                            (long)(_func_int ***)local_f8._8_8_);
          uVar24 = (pointer)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158._M_dataplus._M_p != paVar3) {
            uVar24 = local_158.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar24 < puVar2) {
            puVar25 = (pointer)0xf;
            if ((Issue *)local_f8._0_8_ != (Issue *)(local_f8 + 0x10)) {
              puVar25 = (pointer)local_f8._16_8_;
            }
            if (puVar25 < puVar2) goto LAB_002795dc;
            puVar13 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)local_f8,0,(char *)0x0,(ulong)local_158._M_dataplus._M_p);
          }
          else {
LAB_002795dc:
            puVar13 = (undefined8 *)
                      std::__cxx11::string::_M_append((char *)&local_158,local_f8._0_8_);
          }
          local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
          puVar18 = puVar13 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar13 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar18) {
            local_138.field_2._M_allocated_capacity = *puVar18;
            local_138.field_2._8_8_ = puVar13[3];
          }
          else {
            local_138.field_2._M_allocated_capacity = *puVar18;
            local_138._M_dataplus._M_p = (pointer)*puVar13;
          }
          local_138._M_string_length = puVar13[1];
          *puVar13 = puVar18;
          puVar13[1] = 0;
          *(undefined1 *)puVar18 = 0;
          plVar12 = (long *)std::__cxx11::string::append((char *)&local_138);
          puVar14 = (ulong *)(plVar12 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar12 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar14) {
            local_118.field_2._M_allocated_capacity = *puVar14;
            local_118.field_2._8_8_ = plVar12[3];
            local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
          }
          else {
            local_118.field_2._M_allocated_capacity = *puVar14;
            local_118._M_dataplus._M_p = (pointer)*plVar12;
          }
          local_118._M_string_length = plVar12[1];
          *plVar12 = (long)puVar14;
          plVar12[1] = 0;
          *(undefined1 *)(plVar12 + 2) = 0;
          puVar13 = (undefined8 *)
                    std::__cxx11::string::_M_append
                              ((char *)&local_118,(ulong)local_1b8._M_dataplus._M_p);
          ppeVar15 = (element_type **)(puVar13 + 2);
          if ((element_type **)*puVar13 == ppeVar15) {
            local_168 = *ppeVar15;
            uStack_160 = puVar13[3];
            local_178 = &local_168;
          }
          else {
            local_168 = *ppeVar15;
            local_178 = (element_type **)*puVar13;
          }
          local_170 = puVar13[1];
          *puVar13 = ppeVar15;
          puVar13[1] = 0;
          *(undefined1 *)(puVar13 + 2) = 0;
          plVar12 = (long *)std::__cxx11::string::append((char *)&local_178);
          pCVar20 = (Component *)(plVar12 + 2);
          if ((Component *)*plVar12 == pCVar20) {
            local_198._16_8_ =
                 (pCVar20->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.
                 super_Entity._vptr_Entity;
            local_198._24_8_ = plVar12[3];
            local_198._0_8_ = (Component *)(local_198 + 0x10);
          }
          else {
            local_198._16_8_ =
                 (pCVar20->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.
                 super_Entity._vptr_Entity;
            local_198._0_8_ = (Component *)*plVar12;
          }
          local_198._8_8_ = plVar12[1];
          *plVar12 = (long)pCVar20;
          plVar12[1] = 0;
          *(undefined1 *)(plVar12 + 2) = 0;
          Issue::IssueImpl::setDescription(pIVar4,(string *)local_198);
          if ((Component *)local_198._0_8_ != (Component *)(local_198 + 0x10)) {
            operator_delete((void *)local_198._0_8_,(ulong)(local_198._16_8_ + 1));
          }
          if (local_178 != &local_168) {
            operator_delete(local_178,
                            (ulong)((long)&(local_168->super_ComponentEntity).super_NamedEntity.
                                           super_ParentedEntity.super_Entity._vptr_Entity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != &local_118.field_2) {
            operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p != &local_138.field_2) {
            operator_delete(local_138._M_dataplus._M_p,
                            (ulong)(local_138.field_2._M_allocated_capacity + 1));
          }
          if ((Issue *)local_f8._0_8_ != (Issue *)(local_f8 + 0x10)) {
            operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158._M_dataplus._M_p != paVar3) {
            operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
          }
          pVVar7 = local_88;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
            operator_delete(local_d8._M_dataplus._M_p,
                            (ulong)(local_d8.field_2._M_allocated_capacity + 1));
          }
          AnyCellmlElement::AnyCellmlElementImpl::setVariable
                    ((AnyCellmlElementImpl *)
                     **(undefined8 **)(*(long *)(local_60._M_dataplus._M_p + 8) + 0x28),variable);
          Issue::IssueImpl::setReferenceRule
                    (*(IssueImpl **)(local_60._M_dataplus._M_p + 8),VARIABLE_UNITS_VALUE);
          Logger::LoggerImpl::addIssue(&pVVar7->super_LoggerImpl,(IssuePtr *)&local_60);
          local_38._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._M_string_length !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._M_string_length);
            local_38._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_;
          }
        }
        goto LAB_002798a2;
      }
    }
    else {
      makeIssueIllegalIdentifier((ValidatorImpl *)&stack0xffffffffffffffc0,(string *)pCVar20);
      pIVar4 = local_40->mPimpl;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8,
                     "Variable \'",&local_80);
      plVar12 = (long *)std::__cxx11::string::append(local_f8);
      paVar3 = &local_d8.field_2;
      puVar14 = (ulong *)(plVar12 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar14) {
        local_d8.field_2._M_allocated_capacity = *puVar14;
        local_d8.field_2._8_8_ = plVar12[3];
        local_d8._M_dataplus._M_p = (pointer)paVar3;
      }
      else {
        local_d8.field_2._M_allocated_capacity = *puVar14;
        local_d8._M_dataplus._M_p = (pointer)*plVar12;
      }
      local_d8._M_string_length = plVar12[1];
      *plVar12 = (long)puVar14;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      NamedEntity::name_abi_cxx11_
                ((string *)local_b8,
                 (NamedEntity *)
                 local_98.
                 super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr);
      psVar19 = (pointer)((long)(_func_int ***)local_b8._8_8_ + local_d8._M_string_length);
      uVar24 = (pointer)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != paVar3) {
        uVar24 = local_d8.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar24 < psVar19) {
        psVar21 = (pointer)0xf;
        if ((Model *)local_b8._0_8_ != (Model *)(local_b8 + 0x10)) {
          psVar21 = (pointer)local_b8._16_8_;
        }
        if (psVar21 < psVar19) goto LAB_00278ec0;
        puVar13 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)local_b8,0,(char *)0x0,(ulong)local_d8._M_dataplus._M_p);
      }
      else {
LAB_00278ec0:
        puVar13 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_d8,local_b8._0_8_);
      }
      local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
      puVar14 = puVar13 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar13 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar14) {
        local_158.field_2._M_allocated_capacity = *puVar14;
        local_158.field_2._8_8_ = puVar13[3];
      }
      else {
        local_158.field_2._M_allocated_capacity = *puVar14;
        local_158._M_dataplus._M_p = (pointer)*puVar13;
      }
      local_158._M_string_length = puVar13[1];
      *puVar13 = puVar14;
      puVar13[1] = 0;
      *(undefined1 *)puVar14 = 0;
      puVar13 = (undefined8 *)std::__cxx11::string::append((char *)&local_158);
      puVar18 = puVar13 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar13 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar18) {
        local_138.field_2._M_allocated_capacity = *puVar18;
        local_138.field_2._8_8_ = puVar13[3];
        local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      }
      else {
        local_138.field_2._M_allocated_capacity = *puVar18;
        local_138._M_dataplus._M_p = (pointer)*puVar13;
      }
      local_138._M_string_length = puVar13[1];
      *puVar13 = puVar18;
      puVar13[1] = 0;
      *(undefined1 *)(puVar13 + 2) = 0;
      plVar12 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&local_138,(ulong)local_1b8._M_dataplus._M_p);
      puVar14 = (ulong *)(plVar12 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar14) {
        local_118.field_2._M_allocated_capacity = *puVar14;
        local_118.field_2._8_8_ = plVar12[3];
        local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      }
      else {
        local_118.field_2._M_allocated_capacity = *puVar14;
        local_118._M_dataplus._M_p = (pointer)*plVar12;
      }
      local_118._M_string_length = plVar12[1];
      *plVar12 = (long)puVar14;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      puVar13 = (undefined8 *)std::__cxx11::string::append((char *)&local_118);
      ppeVar15 = (element_type **)(puVar13 + 2);
      if ((element_type **)*puVar13 == ppeVar15) {
        local_168 = *ppeVar15;
        uStack_160 = puVar13[3];
        local_178 = &local_168;
      }
      else {
        local_168 = *ppeVar15;
        local_178 = (element_type **)*puVar13;
      }
      local_170 = puVar13[1];
      *puVar13 = ppeVar15;
      puVar13[1] = 0;
      *(undefined1 *)(puVar13 + 2) = 0;
      Issue::description_abi_cxx11_(&local_60,local_40);
      peVar22 = (element_type *)(local_170 + (long)(_func_int ***)local_60._M_string_length);
      peVar23 = (element_type *)0xf;
      if (local_178 != &local_168) {
        peVar23 = local_168;
      }
      if (peVar23 < peVar22) {
        uVar24 = (element_type *)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          uVar24 = local_60.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar24 < peVar22) goto LAB_00279147;
        plVar12 = (long *)std::__cxx11::string::replace
                                    ((ulong)&local_60,0,(char *)0x0,(ulong)local_178);
      }
      else {
LAB_00279147:
        plVar12 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_178,(ulong)local_60._M_dataplus._M_p);
      }
      local_198._0_8_ = local_198 + 0x10;
      pCVar20 = (Component *)(plVar12 + 2);
      if ((Component *)*plVar12 == pCVar20) {
        local_198._16_8_ =
             (pCVar20->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity.
             _vptr_Entity;
        local_198._24_8_ = plVar12[3];
      }
      else {
        local_198._16_8_ =
             (pCVar20->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity.
             _vptr_Entity;
        local_198._0_8_ = (Component *)*plVar12;
      }
      local_198._8_8_ = plVar12[1];
      *plVar12 = (long)pCVar20;
      plVar12[1] = 0;
      *(undefined1 *)
       &(pCVar20->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity.
        _vptr_Entity = 0;
      Issue::IssueImpl::setDescription(pIVar4,(string *)local_198);
      if ((Component *)local_198._0_8_ != (Component *)(local_198 + 0x10)) {
        operator_delete((void *)local_198._0_8_,(ulong)(local_198._16_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,
                        (ulong)(local_60.field_2._M_allocated_capacity + 1));
      }
      if (local_178 != &local_168) {
        operator_delete(local_178,
                        (ulong)((long)&(local_168->super_ComponentEntity).super_NamedEntity.
                                       super_ParentedEntity.super_Entity._vptr_Entity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p,
                        (ulong)(local_138.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != &local_158.field_2) {
        operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
      }
      if ((Model *)local_b8._0_8_ != (Model *)(local_b8 + 0x10)) {
        operator_delete((void *)local_b8._0_8_,(ulong)(local_b8._16_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != paVar3) {
        operator_delete(local_d8._M_dataplus._M_p,
                        (ulong)(local_d8.field_2._M_allocated_capacity + 1));
      }
      pVVar7 = local_88;
      if ((Issue *)local_f8._0_8_ != (Issue *)(local_f8 + 0x10)) {
        operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
      }
      AnyCellmlElement::AnyCellmlElementImpl::setVariable
                (((local_40->mPimpl->mItem).
                  super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 )->mPimpl,variable);
      Issue::IssueImpl::setReferenceRule(local_40->mPimpl,VARIABLE_UNITS_VALUE);
      Logger::LoggerImpl::addIssue(&pVVar7->super_LoggerImpl,(IssuePtr *)&stack0xffffffffffffffc0);
LAB_002798a2:
      if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
    }
  }
  Variable::interfaceType_abi_cxx11_
            (&local_1b8,
             (variable->super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
  ;
  sVar6 = local_1b8._M_string_length;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar6 !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Variable::interfaceType_abi_cxx11_
              (&local_1b8,
               (variable->super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr);
    iVar10 = std::__cxx11::string::compare((char *)&local_1b8);
    if ((((iVar10 != 0) && (iVar10 = std::__cxx11::string::compare((char *)&local_1b8), iVar10 != 0)
         ) && (iVar10 = std::__cxx11::string::compare((char *)&local_1b8), iVar10 != 0)) &&
       (iVar10 = std::__cxx11::string::compare((char *)&local_1b8), iVar10 != 0)) {
      Issue::IssueImpl::create();
      pIVar4 = *(IssueImpl **)(local_b8._0_8_ + 8);
      std::operator+(&local_d8,"Variable \'",&local_80);
      puVar13 = (undefined8 *)std::__cxx11::string::append((char *)&local_d8);
      paVar3 = &local_158.field_2;
      puVar14 = puVar13 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar13 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar14) {
        local_158.field_2._M_allocated_capacity = *puVar14;
        local_158.field_2._8_8_ = puVar13[3];
        local_158._M_dataplus._M_p = (pointer)paVar3;
      }
      else {
        local_158.field_2._M_allocated_capacity = *puVar14;
        local_158._M_dataplus._M_p = (pointer)*puVar13;
      }
      local_158._M_string_length = puVar13[1];
      *puVar13 = puVar14;
      puVar13[1] = 0;
      *(undefined1 *)(puVar13 + 2) = 0;
      NamedEntity::name_abi_cxx11_
                ((string *)local_f8,
                 (NamedEntity *)
                 local_98.
                 super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr);
      puVar2 = (pointer)((long)(_func_int ***)local_158._M_string_length +
                        (long)(_func_int ***)local_f8._8_8_);
      uVar24 = (pointer)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != paVar3) {
        uVar24 = local_158.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar24 < puVar2) {
        puVar25 = (pointer)0xf;
        if ((Issue *)local_f8._0_8_ != (Issue *)(local_f8 + 0x10)) {
          puVar25 = (pointer)local_f8._16_8_;
        }
        if (puVar25 < puVar2) goto LAB_00279a47;
        puVar13 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)local_f8,0,(char *)0x0,(ulong)local_158._M_dataplus._M_p);
      }
      else {
LAB_00279a47:
        puVar13 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_158,local_f8._0_8_);
      }
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      puVar18 = puVar13 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar13 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar18) {
        local_138.field_2._M_allocated_capacity = *puVar18;
        local_138.field_2._8_8_ = puVar13[3];
      }
      else {
        local_138.field_2._M_allocated_capacity = *puVar18;
        local_138._M_dataplus._M_p = (pointer)*puVar13;
      }
      local_138._M_string_length = puVar13[1];
      *puVar13 = puVar18;
      puVar13[1] = 0;
      *(undefined1 *)puVar18 = 0;
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_138);
      puVar14 = (ulong *)(plVar12 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar14) {
        local_118.field_2._M_allocated_capacity = *puVar14;
        local_118.field_2._8_8_ = plVar12[3];
        local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      }
      else {
        local_118.field_2._M_allocated_capacity = *puVar14;
        local_118._M_dataplus._M_p = (pointer)*plVar12;
      }
      local_118._M_string_length = plVar12[1];
      *plVar12 = (long)puVar14;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      puVar13 = (undefined8 *)
                std::__cxx11::string::_M_append
                          ((char *)&local_118,(ulong)local_1b8._M_dataplus._M_p);
      ppeVar15 = (element_type **)(puVar13 + 2);
      if ((element_type **)*puVar13 == ppeVar15) {
        local_168 = *ppeVar15;
        uStack_160 = puVar13[3];
        local_178 = &local_168;
      }
      else {
        local_168 = *ppeVar15;
        local_178 = (element_type **)*puVar13;
      }
      local_170 = puVar13[1];
      *puVar13 = ppeVar15;
      puVar13[1] = 0;
      *(undefined1 *)(puVar13 + 2) = 0;
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_178);
      pCVar20 = (Component *)(plVar12 + 2);
      if ((Component *)*plVar12 == pCVar20) {
        local_198._16_8_ =
             (pCVar20->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity.
             _vptr_Entity;
        local_198._24_8_ = plVar12[3];
        local_198._0_8_ = (Component *)(local_198 + 0x10);
      }
      else {
        local_198._16_8_ =
             (pCVar20->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity.
             _vptr_Entity;
        local_198._0_8_ = (Component *)*plVar12;
      }
      local_198._8_8_ = plVar12[1];
      *plVar12 = (long)pCVar20;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      Issue::IssueImpl::setDescription(pIVar4,(string *)local_198);
      if ((Component *)local_198._0_8_ != (Component *)(local_198 + 0x10)) {
        operator_delete((void *)local_198._0_8_,(ulong)(local_198._16_8_ + 1));
      }
      if (local_178 != &local_168) {
        operator_delete(local_178,
                        (ulong)((long)&(local_168->super_ComponentEntity).super_NamedEntity.
                                       super_ParentedEntity.super_Entity._vptr_Entity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p,
                        (ulong)(local_138.field_2._M_allocated_capacity + 1));
      }
      if ((Issue *)local_f8._0_8_ != (Issue *)(local_f8 + 0x10)) {
        operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != paVar3) {
        operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,
                        (ulong)(local_d8.field_2._M_allocated_capacity + 1));
      }
      AnyCellmlElement::AnyCellmlElementImpl::setVariable
                (*(AnyCellmlElementImpl **)
                  (*(EntityImpl **)(local_b8._0_8_ + 8))[1].mId._M_string_length,variable);
      Issue::IssueImpl::setReferenceRule
                (*(IssueImpl **)(local_b8._0_8_ + 8),VARIABLE_INTERFACE_VALUE);
      Logger::LoggerImpl::addIssue(&local_88->super_LoggerImpl,(IssuePtr *)local_b8);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
    }
  }
  Variable::initialValue_abi_cxx11_
            (&local_1b8,
             (variable->super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
  ;
  sVar6 = local_1b8._M_string_length;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar6 ==
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_0027a13a;
  Variable::initialValue_abi_cxx11_
            (&local_1b8,
             (variable->super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
  ;
  bVar8 = Component::hasVariable
                    ((Component *)
                     local_98.
                     super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr,&local_1b8);
  if ((!bVar8) && (bVar8 = isCellMLReal(&local_1b8), !bVar8)) {
    Issue::IssueImpl::create();
    pIVar4 = *(IssueImpl **)(local_b8._0_8_ + 8);
    std::operator+(&local_d8,"Variable \'",&local_80);
    puVar13 = (undefined8 *)std::__cxx11::string::append((char *)&local_d8);
    paVar3 = &local_158.field_2;
    puVar14 = puVar13 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar13 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar14) {
      local_158.field_2._M_allocated_capacity = *puVar14;
      local_158.field_2._8_8_ = puVar13[3];
      local_158._M_dataplus._M_p = (pointer)paVar3;
    }
    else {
      local_158.field_2._M_allocated_capacity = *puVar14;
      local_158._M_dataplus._M_p = (pointer)*puVar13;
    }
    local_158._M_string_length = puVar13[1];
    *puVar13 = puVar14;
    puVar13[1] = 0;
    *(undefined1 *)(puVar13 + 2) = 0;
    NamedEntity::name_abi_cxx11_
              ((string *)local_f8,
               (NamedEntity *)
               local_98.
               super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr);
    puVar2 = (pointer)((long)(_func_int ***)local_158._M_string_length +
                      (long)(_func_int ***)local_f8._8_8_);
    uVar24 = (pointer)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != paVar3) {
      uVar24 = local_158.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar24 < puVar2) {
      puVar25 = (pointer)0xf;
      if ((Issue *)local_f8._0_8_ != (Issue *)(local_f8 + 0x10)) {
        puVar25 = (pointer)local_f8._16_8_;
      }
      if (puVar25 < puVar2) goto LAB_00279e69;
      puVar13 = (undefined8 *)
                std::__cxx11::string::replace
                          ((ulong)local_f8,0,(char *)0x0,(ulong)local_158._M_dataplus._M_p);
    }
    else {
LAB_00279e69:
      puVar13 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_158,local_f8._0_8_);
    }
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    puVar18 = puVar13 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar13 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar18) {
      local_138.field_2._M_allocated_capacity = *puVar18;
      local_138.field_2._8_8_ = puVar13[3];
    }
    else {
      local_138.field_2._M_allocated_capacity = *puVar18;
      local_138._M_dataplus._M_p = (pointer)*puVar13;
    }
    local_138._M_string_length = puVar13[1];
    *puVar13 = puVar18;
    puVar13[1] = 0;
    *(undefined1 *)puVar18 = 0;
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_138);
    puVar14 = (ulong *)(plVar12 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar12 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar14) {
      local_118.field_2._M_allocated_capacity = *puVar14;
      local_118.field_2._8_8_ = plVar12[3];
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    }
    else {
      local_118.field_2._M_allocated_capacity = *puVar14;
      local_118._M_dataplus._M_p = (pointer)*plVar12;
    }
    local_118._M_string_length = plVar12[1];
    *plVar12 = (long)puVar14;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    puVar13 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_118,(ulong)local_1b8._M_dataplus._M_p);
    ppeVar15 = (element_type **)(puVar13 + 2);
    if ((element_type **)*puVar13 == ppeVar15) {
      local_168 = *ppeVar15;
      uStack_160 = puVar13[3];
      local_178 = &local_168;
    }
    else {
      local_168 = *ppeVar15;
      local_178 = (element_type **)*puVar13;
    }
    local_170 = puVar13[1];
    *puVar13 = ppeVar15;
    puVar13[1] = 0;
    *(undefined1 *)(puVar13 + 2) = 0;
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_178);
    pCVar20 = (Component *)(plVar12 + 2);
    if ((Component *)*plVar12 == pCVar20) {
      local_198._16_8_ =
           (pCVar20->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity.
           _vptr_Entity;
      local_198._24_8_ = plVar12[3];
      local_198._0_8_ = (Component *)(local_198 + 0x10);
    }
    else {
      local_198._16_8_ =
           (pCVar20->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity.
           _vptr_Entity;
      local_198._0_8_ = (Component *)*plVar12;
    }
    local_198._8_8_ = plVar12[1];
    *plVar12 = (long)pCVar20;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    Issue::IssueImpl::setDescription(pIVar4,(string *)local_198);
    if ((Component *)local_198._0_8_ != (Component *)(local_198 + 0x10)) {
      operator_delete((void *)local_198._0_8_,(ulong)(local_198._16_8_ + 1));
    }
    if (local_178 != &local_168) {
      operator_delete(local_178,
                      (ulong)((long)&(local_168->super_ComponentEntity).super_NamedEntity.
                                     super_ParentedEntity.super_Entity._vptr_Entity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p,
                      (ulong)(local_138.field_2._M_allocated_capacity + 1));
    }
    if ((Issue *)local_f8._0_8_ != (Issue *)(local_f8 + 0x10)) {
      operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != paVar3) {
      operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,(ulong)(local_d8.field_2._M_allocated_capacity + 1))
      ;
    }
    AnyCellmlElement::AnyCellmlElementImpl::setVariable
              (*(AnyCellmlElementImpl **)
                (*(EntityImpl **)(local_b8._0_8_ + 8))[1].mId._M_string_length,variable);
    Issue::IssueImpl::setReferenceRule
              (*(IssueImpl **)(local_b8._0_8_ + 8),VARIABLE_INITIAL_VALUE_VALUE);
    Logger::LoggerImpl::addIssue(&local_88->super_LoggerImpl,(IssuePtr *)local_b8);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
LAB_0027a13a:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if (local_98.super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.
               super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

void Validator::ValidatorImpl::validateVariable(const VariablePtr &variable, const NameList &variableNames)
{
    ComponentPtr component = owningComponent(variable);
    auto variableName = variable->name();
    if (!variableName.empty()) {
        if (std::find(variableNames.begin(), variableNames.end(), variableName) != variableNames.end()) {
            auto issue = Issue::IssueImpl::create();
            issue->mPimpl->setDescription("Component '" + component->name() + "' contains multiple variables with the name '" + variableName + "'. Valid variable names must be unique to their component.");
            issue->mPimpl->mItem->mPimpl->setComponent(component);
            issue->mPimpl->setReferenceRule(Issue::ReferenceRule::VARIABLE_NAME_UNIQUE);
            addIssue(issue);
        }
    }

    // Check for a valid name attribute.
    if (!isCellmlIdentifier(variableName)) {
        auto issue = makeIssueIllegalIdentifier(variableName);
        issue->mPimpl->setDescription("Variable '" + variableName + "' in component '" + component->name() + "' does not have a valid name attribute. " + issue->description());
        issue->mPimpl->mItem->mPimpl->setVariable(variable);
        issue->mPimpl->setReferenceRule(Issue::ReferenceRule::VARIABLE_NAME_VALUE);
        addIssue(issue);
    }
    // Check for a valid identifier.
    if (!isValidXmlName(variable->id())) {
        auto issue = Issue::IssueImpl::create();
        issue->mPimpl->setReferenceRule(Issue::ReferenceRule::XML_ID_ATTRIBUTE);
        issue->mPimpl->mItem->mPimpl->setVariable(variable);
        issue->mPimpl->setDescription("Variable '" + variableName + "' does not have a valid 'id' attribute, '" + variable->id() + "'.");
        addIssue(issue);
    }
    // Check for a valid units attribute.
    if (variable->units() == nullptr) {
        auto issue = Issue::IssueImpl::create();
        issue->mPimpl->setDescription("Variable '" + variableName + "' in component '" + component->name() + "' does not have any units specified.");
        issue->mPimpl->mItem->mPimpl->setVariable(variable);
        issue->mPimpl->setReferenceRule(Issue::ReferenceRule::VARIABLE_UNITS_VALUE);
        addIssue(issue);
    } else {
        std::string unitsName = variable->units()->name();
        if (!isCellmlIdentifier(unitsName)) {
            auto issue = makeIssueIllegalIdentifier(unitsName);
            issue->mPimpl->setDescription("Variable '" + variableName + "' in component '" + component->name() + "' does not have a valid units attribute. The attribute given is '" + unitsName + "'. " + issue->description());
            issue->mPimpl->mItem->mPimpl->setVariable(variable);
            issue->mPimpl->setReferenceRule(Issue::ReferenceRule::VARIABLE_UNITS_VALUE);
            addIssue(issue);
        } else if (!isStandardUnitName(unitsName)) {
            ModelPtr model = owningModel(component);
            if (!model->hasUnits(unitsName)) {
                auto issue = Issue::IssueImpl::create();
                issue->mPimpl->setDescription("Variable '" + variableName + "' in component '" + component->name() + "' has a units reference '" + unitsName + "' which is neither standard nor defined in the parent model.");
                issue->mPimpl->mItem->mPimpl->setVariable(variable);
                issue->mPimpl->setReferenceRule(Issue::ReferenceRule::VARIABLE_UNITS_VALUE);
                addIssue(issue);
            }
        }
    }
    // Check for a valid interface attribute.
    if (!variable->interfaceType().empty()) {
        std::string interfaceType = variable->interfaceType();
        if ((interfaceType != "public") && (interfaceType != "private") && (interfaceType != "none") && (interfaceType != "public_and_private")) {
            auto issue = Issue::IssueImpl::create();
            issue->mPimpl->setDescription("Variable '" + variableName + "' in component '" + component->name() + "' has an invalid interface attribute value '" + interfaceType + "'.");
            issue->mPimpl->mItem->mPimpl->setVariable(variable);
            issue->mPimpl->setReferenceRule(Issue::ReferenceRule::VARIABLE_INTERFACE_VALUE);
            addIssue(issue);
        }
    }
    // Check for a valid initial value attribute.
    if (!variable->initialValue().empty()) {
        std::string initialValue = variable->initialValue();
        // Check if initial value is a variable reference
        if (!component->hasVariable(initialValue)) {
            // Otherwise, check that the initial value can be converted to a double
            if (!isCellMLReal(initialValue)) {
                auto issue = Issue::IssueImpl::create();
                issue->mPimpl->setDescription("Variable '" + variableName + "' in component '" + component->name() + "' has an invalid initial value '" + initialValue + "'. Initial values must be a real number string or a variable reference.");
                issue->mPimpl->mItem->mPimpl->setVariable(variable);
                issue->mPimpl->setReferenceRule(Issue::ReferenceRule::VARIABLE_INITIAL_VALUE_VALUE);
                addIssue(issue);
            }
        }
    }
}